

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  int *piVar1;
  undefined1 auVar2 [16];
  ImVec2 *__dest;
  ImGuiContext *pIVar3;
  int iVar4;
  ImVec2 *pIVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  float in_XMM0_Db;
  float in_XMM1_Db;
  float in_XMM2_Db;
  float in_XMM3_Db;
  float in_XMM4_Db;
  float fVar12;
  float in_XMM5_Db;
  float fVar13;
  float fVar14;
  float fVar15;
  float in_XMM6_Db;
  undefined1 auVar16 [16];
  float in_XMM7_Db;
  float fVar17;
  float fVar18;
  
  iVar7 = 10;
  if (10 < level) {
    iVar7 = level;
  }
  iVar6 = level + 1;
  while( true ) {
    pIVar3 = GImGui;
    fVar17 = x4 - x1;
    fVar18 = y4 - y1;
    fVar12 = fVar18 * (x2 - x4) - fVar17 * (y2 - y4);
    fVar13 = fVar18 * (x3 - x4) - fVar17 * (y3 - y4);
    fVar14 = fVar18 * (in_XMM0_Db - x4) - fVar17 * (in_XMM1_Db - y4);
    fVar15 = fVar18 * (in_XMM4_Db - x4) - fVar17 * (in_XMM5_Db - y4);
    uVar8 = -(uint)(-fVar12 <= fVar12);
    uVar9 = -(uint)(-fVar13 <= fVar13);
    uVar10 = -(uint)(-fVar14 <= fVar14);
    uVar11 = -(uint)(-fVar15 <= fVar15);
    auVar16._0_4_ = ~uVar8 & (uint)-fVar12;
    auVar16._4_4_ = ~uVar9 & (uint)-fVar13;
    auVar16._8_4_ = ~uVar10 & (uint)-fVar14;
    auVar16._12_4_ = ~uVar11 & (uint)-fVar15;
    auVar2._4_4_ = (uint)fVar13 & uVar9;
    auVar2._0_4_ = (uint)fVar12 & uVar8;
    auVar2._8_4_ = (uint)fVar14 & uVar10;
    auVar2._12_4_ = (uint)fVar15 & uVar11;
    fVar12 = SUB164(auVar16 | auVar2,4) + SUB164(auVar16 | auVar2,0);
    if (fVar12 * fVar12 < (fVar17 * fVar17 + fVar18 * fVar18) * tess_tol) break;
    if (iVar6 - iVar7 == 1) {
      return;
    }
    fVar12 = (x3 + x2) * 0.5;
    fVar14 = (y3 + y2) * 0.5;
    fVar15 = (x2 + x1) * 0.5;
    x3 = (x4 + x3) * 0.5;
    in_XMM0_Db = (in_XMM2_Db + in_XMM0_Db) * 0.0;
    in_XMM4_Db = (in_XMM6_Db + in_XMM4_Db) * 0.0;
    fVar13 = (fVar12 + fVar15) * 0.5;
    x2 = (fVar12 + x3) * 0.5;
    fVar17 = (y2 + y1) * 0.5;
    y3 = (y4 + y3) * 0.5;
    in_XMM1_Db = (in_XMM3_Db + in_XMM1_Db) * 0.0;
    in_XMM5_Db = (in_XMM7_Db + in_XMM5_Db) * 0.0;
    fVar12 = (fVar14 + fVar17) * 0.5;
    y2 = (fVar14 + y3) * 0.5;
    fVar14 = (x2 + fVar13) * 0.5;
    fVar18 = (y2 + fVar12) * 0.5;
    PathBezierToCasteljau(path,x1,y1,fVar15,fVar17,fVar13,fVar12,fVar14,fVar18,tess_tol,iVar6);
    iVar6 = iVar6 + 1;
    x1 = fVar14;
    y1 = fVar18;
    in_XMM2_Db = x2;
    in_XMM3_Db = y2;
  }
  iVar7 = path->Size;
  if (iVar7 != path->Capacity) {
    __dest = path->Data;
    goto LAB_0014dc77;
  }
  if (iVar7 == 0) {
    iVar6 = 8;
  }
  else {
    iVar6 = iVar7 / 2 + iVar7;
  }
  iVar4 = iVar7 + 1;
  if (iVar7 + 1 < iVar6) {
    iVar4 = iVar6;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImVec2 *)(*(pIVar3->IO).MemAllocFn)((long)iVar4 << 3);
  if (path->Data == (ImVec2 *)0x0) {
LAB_0014dc5b:
    pIVar5 = (ImVec2 *)0x0;
    pIVar3 = GImGui;
  }
  else {
    memcpy(__dest,path->Data,(long)path->Size << 3);
    pIVar3 = GImGui;
    pIVar5 = path->Data;
    if (pIVar5 == (ImVec2 *)0x0) goto LAB_0014dc5b;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar3->IO).MemFreeFn)(pIVar5);
  path->Data = __dest;
  path->Capacity = iVar4;
  iVar7 = path->Size;
LAB_0014dc77:
  path->Size = iVar7 + 1;
  __dest[iVar7].x = x4;
  __dest[iVar7].y = y4;
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2+d3) * (d2+d3) < tess_tol * (dx*dx + dy*dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1+x2)*0.5f,       y12 = (y1+y2)*0.5f;
        float x23 = (x2+x3)*0.5f,       y23 = (y2+y3)*0.5f;
        float x34 = (x3+x4)*0.5f,       y34 = (y3+y4)*0.5f;
        float x123 = (x12+x23)*0.5f,    y123 = (y12+y23)*0.5f;
        float x234 = (x23+x34)*0.5f,    y234 = (y23+y34)*0.5f;
        float x1234 = (x123+x234)*0.5f, y1234 = (y123+y234)*0.5f;

        PathBezierToCasteljau(path, x1,y1,        x12,y12,    x123,y123,  x1234,y1234, tess_tol, level+1);
        PathBezierToCasteljau(path, x1234,y1234,  x234,y234,  x34,y34,    x4,y4,       tess_tol, level+1);
    }
}